

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  pointer pcVar1;
  undefined8 *puVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined1 local_f8 [8];
  string file;
  long local_d0;
  ulong local_c8;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  int local_74;
  undefined1 auStack_70 [4];
  int number_local;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_type *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  local_f8 = (undefined1  [8])&file._M_string_length;
  file._M_dataplus._M_p = (pointer)0x0;
  file._M_string_length._0_1_ = 0;
  local_74 = number;
  if (number == 0) {
    pcVar1 = (base_name->pathname_)._M_dataplus._M_p;
    local_50 = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar4) {
      local_60._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_60._8_8_ = plVar3[3];
      _auStack_70 = (pointer)&local_60;
    }
    else {
      local_60._M_allocated_capacity = paVar4->_M_allocated_capacity;
      _auStack_70 = (pointer)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)paVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_f8,(string *)auStack_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_auStack_70 != &local_60) {
      operator_delete(_auStack_70,local_60._M_allocated_capacity + 1);
    }
    if (local_50 != &__str._M_string_length) {
      operator_delete(local_50,__str._M_string_length + 1);
    }
    goto LAB_00138472;
  }
  pcVar1 = (base_name->pathname_)._M_dataplus._M_p;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (base_name->pathname_)._M_string_length);
  std::__cxx11::string::append((char *)&local_98);
  StreamableToString<int>((string *)((long)&file.field_2 + 8),&local_74);
  uVar6 = 0xf;
  if (local_98 != local_88) {
    uVar6 = local_88[0];
  }
  if (uVar6 < (ulong)(local_d0 + local_90)) {
    uVar6 = 0xf;
    if ((ulong *)file.field_2._8_8_ != &stack0xffffffffffffff38) {
      uVar6 = local_c8;
    }
    if (uVar6 < (ulong)(local_d0 + local_90)) goto LAB_001381f6;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)((long)&file.field_2 + 8),0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_001381f6:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,file.field_2._8_8_);
  }
  local_b8 = &local_a8;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_a8 = *plVar3;
    uStack_a0 = puVar2[3];
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*puVar2;
  }
  local_b0 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    __str._M_string_length = *psVar5;
    __str.field_2._M_allocated_capacity = plVar3[3];
    local_50 = &__str._M_string_length;
  }
  else {
    __str._M_string_length = *psVar5;
    local_50 = (size_type *)*plVar3;
  }
  __str._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar4) {
    local_60._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_60._8_8_ = plVar3[3];
    _auStack_70 = (pointer)&local_60;
  }
  else {
    local_60._M_allocated_capacity = paVar4->_M_allocated_capacity;
    _auStack_70 = (pointer)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)paVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_f8,(string *)auStack_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_auStack_70 != &local_60) {
    operator_delete(_auStack_70,local_60._M_allocated_capacity + 1);
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50,__str._M_string_length + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((ulong *)file.field_2._8_8_ != &stack0xffffffffffffff38) {
    operator_delete((void *)file.field_2._8_8_,local_c8 + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
LAB_00138472:
  FilePath((FilePath *)auStack_70,(string *)local_f8);
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)auStack_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_auStack_70 != &local_60) {
    operator_delete(_auStack_70,local_60._M_allocated_capacity + 1);
  }
  if (local_f8 != (undefined1  [8])&file._M_string_length) {
    operator_delete((void *)local_f8,
                    CONCAT71(file._M_string_length._1_7_,(undefined1)file._M_string_length) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}